

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void pybind11::class_<SomeClass>::dealloc(value_and_holder *v_h)

{
  byte bVar1;
  SomeClass *__ptr;
  default_delete<SomeClass> *this;
  
  bVar1 = v_h->inst->field_0x30;
  if ((bVar1 & 2) == 0) {
    if ((v_h->inst->field_1).nonsimple.holder_constructed[v_h->index] == true) {
LAB_001112aa:
      __ptr = (SomeClass *)v_h->vh[1];
      this = (default_delete<SomeClass> *)(v_h->vh + 1);
      if (__ptr != (SomeClass *)0x0) {
        std::default_delete<SomeClass>::operator()(this,__ptr);
      }
      *(undefined8 *)this = 0;
      return;
    }
  }
  else if ((bVar1 & 4) != 0) goto LAB_001112aa;
  operator_delete(*v_h->vh);
  return;
}

Assistant:

bool holder_constructed() const {
        return inst->simple_layout
            ? inst->simple_holder_constructed
            : inst->nonsimple.holder_constructed[index];
    }